

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O0

void nesapu_set_mute_mask(void *chip,UINT32 MuteMask)

{
  nesapu_state *info;
  UINT32 MuteMask_local;
  void *chip_local;
  
  *(bool *)((long)chip + 0x24) = (MuteMask & 1) != 0;
  *(bool *)((long)chip + 0x4c) = (MuteMask >> 1 & 1) != 0;
  *(bool *)((long)chip + 0x74) = (MuteMask >> 2 & 1) != 0;
  *(bool *)((long)chip + 0x97) = (MuteMask >> 3 & 1) != 0;
  *(bool *)((long)chip + 0xc3) = (MuteMask >> 4 & 1) != 0;
  return;
}

Assistant:

void nesapu_set_mute_mask(void* chip, UINT32 MuteMask)
{
	nesapu_state *info = (nesapu_state*)chip;
	
	info->APU.squ[0].Muted = (MuteMask >> 0) & 0x01;
	info->APU.squ[1].Muted = (MuteMask >> 1) & 0x01;
	info->APU.tri.Muted = (MuteMask >> 2) & 0x01;
	info->APU.noi.Muted = (MuteMask >> 3) & 0x01;
	info->APU.dpcm.Muted = (MuteMask >> 4) & 0x01;
	
	return;
}